

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regenc.c
# Opt level: O0

int onigenc_with_ascii_strncmp(OnigEncoding enc,OnigUChar *p,OnigUChar *end,OnigUChar *sascii,int n)

{
  OnigCodePoint OVar1;
  int iVar2;
  int c;
  int x;
  int n_local;
  OnigUChar *sascii_local;
  OnigUChar *end_local;
  OnigUChar *p_local;
  OnigEncoding enc_local;
  
  c = n;
  _x = sascii;
  end_local = p;
  while( true ) {
    if (c < 1) {
      return 0;
    }
    if (end <= end_local) break;
    OVar1 = (*enc->mbc_to_code)(end_local,end);
    if (*_x - OVar1 != 0) {
      return *_x - OVar1;
    }
    _x = _x + 1;
    iVar2 = (*enc->mbc_enc_len)(end_local);
    end_local = end_local + iVar2;
    c = c + -1;
  }
  return (uint)*_x;
}

Assistant:

extern int
onigenc_with_ascii_strncmp(OnigEncoding enc, const UChar* p, const UChar* end,
                           const UChar* sascii /* ascii */, int n)
{
  int x, c;

  while (n-- > 0) {
    if (p >= end) return (int )(*sascii);

    c = (int )ONIGENC_MBC_TO_CODE(enc, p, end);
    x = *sascii - c;
    if (x) return x;

    sascii++;
    p += enclen(enc, p);
  }
  return 0;
}